

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O2

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddPoint
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,
          double radius,ChVector<double> *pos)

{
  ChCollisionShapeBullet *this_00;
  cbtCollisionShape *this_01;
  float fVar1;
  double dVar2;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_80;
  ChMatrix33<double> local_70;
  
  dVar2 = radius;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])();
  fVar1 = SUB84(dVar2,0);
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  ChCollisionShapeBullet::ChCollisionShapeBullet
            (this_00,POINT,(shared_ptr<chrono::ChMaterialSurface> *)&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  this_01 = (cbtCollisionShape *)cbtSphereShape::operator_new(0x48);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  cbtPointShape::cbtPointShape((cbtPointShape *)this_01,(float)((double)fVar1 + radius));
  this_00->m_bt_shape = this_01;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  (*this_01->_vptr_cbtCollisionShape[0xb])(this_01);
  ChMatrix33<double>::ChMatrix33(&local_70,1.0);
  injectShape(this,pos,&local_70,this_00);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddPoint(std::shared_ptr<ChMaterialSurface> material,
                                      double radius,
                                      const ChVector<>& pos) {
    // adjust default inward 'safe' margin (always as radius)
    SetSafeMargin(radius);

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::POINT, material);

    shape->m_bt_shape = new cbtPointShape((cbtScalar)(radius + GetEnvelope()));
    shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());

    injectShape(pos, ChMatrix33<>(1), shape);
    return true;
}